

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::pmin(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  long local_30;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if (((uint)uVar1 & 6) == 4) {
    lt((Literal *)&local_40.func,other,this);
    if (local_30 == 2) {
      if (local_40.i32 == 0) {
        other = this;
      }
      Literal(__return_storage_ptr__,other);
      ~Literal((Literal *)&local_40.func);
      return __return_storage_ptr__;
    }
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                  ,0x120,"int32_t wasm::Literal::geti32() const");
  }
  handle_unreachable("unexpected type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                     ,0x69b);
}

Assistant:

Literal Literal::pmin(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32:
    case Type::f64:
      return other.lt(*this).geti32() ? other : *this;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}